

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O2

void llvm::report_fatal_error(Twine *Reason,bool GenCrashDiag)

{
  fatal_error_handler_t p_Var1;
  void *pvVar2;
  raw_ostream *OS_00;
  SmallVector<char,_64U> Buffer;
  raw_svector_ostream OS;
  
  std::mutex::lock(&ErrorHandlerMutex);
  pvVar2 = ErrorHandlerUserData;
  p_Var1 = ErrorHandler_abi_cxx11_;
  pthread_mutex_unlock((pthread_mutex_t *)&ErrorHandlerMutex);
  if (p_Var1 == (fatal_error_handler_t)0x0) {
    Buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX =
         &Buffer.super_SmallVectorStorage<char,_64U>;
    Buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
    Buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x40;
    raw_svector_ostream::raw_svector_ostream(&OS,&Buffer.super_SmallVectorImpl<char>);
    OS_00 = raw_ostream::operator<<((raw_ostream *)&OS,"LLVM ERROR: ");
    Twine::print(Reason,OS_00);
    raw_ostream::operator<<(OS_00,"\n");
    write(2,((OS.OS)->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
          (ulong)((OS.OS)->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size);
    raw_ostream::~raw_ostream((raw_ostream *)&OS);
    SmallVectorImpl<char>::~SmallVectorImpl(&Buffer.super_SmallVectorImpl<char>);
  }
  else {
    Twine::str_abi_cxx11_((string *)&Buffer,Reason);
    (*p_Var1)(pvVar2,(string *)&Buffer,GenCrashDiag);
    std::__cxx11::string::_M_dispose();
  }
  sys::RunInterruptHandlers();
  exit(1);
}

Assistant:

void llvm::report_fatal_error(const Twine &Reason, bool GenCrashDiag) {
  llvm::fatal_error_handler_t handler = nullptr;
  void* handlerData = nullptr;
  {
    // Only acquire the mutex while reading the handler, so as not to invoke a
    // user-supplied callback under a lock.
#if LLVM_ENABLE_THREADS == 1
    std::lock_guard<std::mutex> Lock(ErrorHandlerMutex);
#endif
    handler = ErrorHandler;
    handlerData = ErrorHandlerUserData;
  }

  if (handler) {
    handler(handlerData, Reason.str(), GenCrashDiag);
  } else {
    // Blast the result out to stderr.  We don't try hard to make sure this
    // succeeds (e.g. handling EINTR) and we can't use errs() here because
    // raw ostreams can call report_fatal_error.
    SmallVector<char, 64> Buffer;
    raw_svector_ostream OS(Buffer);
    OS << "LLVM ERROR: " << Reason << "\n";
    StringRef MessageStr = OS.str();
    ssize_t written = ::write(2, MessageStr.data(), MessageStr.size());
    (void)written; // If something went wrong, we deliberately just give up.
  }

  // If we reached here, we are failing ungracefully. Run the interrupt handlers
  // to make sure any special cleanups get done, in particular that we remove
  // files registered with RemoveFileOnSignal.
  sys::RunInterruptHandlers();

  exit(1);
}